

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

ElementMatcherPairs * testing::internal::FindMaxBipartiteMatching(MatchMatrix *g)

{
  MaxBipartiteMatchState *in_RDI;
  MaxBipartiteMatchState *in_stack_00000038;
  MatchMatrix *in_stack_ffffffffffffffd8;
  MaxBipartiteMatchState *in_stack_ffffffffffffffe0;
  
  MaxBipartiteMatchState::MaxBipartiteMatchState
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  MaxBipartiteMatchState::Compute(in_stack_00000038);
  MaxBipartiteMatchState::~MaxBipartiteMatchState(in_RDI);
  return (ElementMatcherPairs *)in_RDI;
}

Assistant:

GTEST_API_ ElementMatcherPairs
FindMaxBipartiteMatching(const MatchMatrix& g) {
  return MaxBipartiteMatchState(g).Compute();
}